

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

void __thiscall t_dart_generator::init_generator(t_dart_generator *this)

{
  int iVar1;
  int *piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char *pcVar4;
  allocator local_81;
  string subdir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&subdir,this);
  iVar1 = mkdir(subdir._M_dataplus._M_p,0x1ff);
  std::__cxx11::string::~string((string *)&subdir);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 != 0x11) {
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_40,this);
      std::__cxx11::string::string((string *)&local_60,local_40._M_dataplus._M_p,&local_81);
      std::operator+(&subdir,&local_60,": ");
      pcVar4 = strerror(*piVar2);
      std::operator+(pbVar3,&subdir,pcVar4);
      __cxa_throw(pbVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  if ((this->library_name_)._M_string_length == 0) {
    find_library_name_abi_cxx11_
              (&subdir,this,(this->super_t_oop_generator).super_t_generator.program_);
    std::__cxx11::string::operator=((string *)&this->library_name_,(string *)&subdir);
    std::__cxx11::string::~string((string *)&subdir);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_40,this);
  std::operator+(&local_60,&local_40,"/");
  std::operator+(&subdir,&local_60,&this->library_name_);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  iVar1 = mkdir(subdir._M_dataplus._M_p,0x1ff);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 != 0x11) {
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      std::__cxx11::string::string((string *)&local_40,subdir._M_dataplus._M_p,&local_81);
      std::operator+(&local_60,&local_40,": ");
      pcVar4 = strerror(*piVar2);
      std::operator+(pbVar3,&local_60,pcVar4);
      __cxa_throw(pbVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  std::__cxx11::string::_M_assign((string *)&this->base_dir_);
  if ((this->library_prefix_)._M_string_length == 0) {
    std::__cxx11::string::append((char *)&subdir);
    iVar1 = mkdir(subdir._M_dataplus._M_p,0x1ff);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 != 0x11) {
        pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
        std::__cxx11::string::string((string *)&local_40,subdir._M_dataplus._M_p,&local_81);
        std::operator+(&local_60,&local_40,": ");
        pcVar4 = strerror(*piVar2);
        std::operator+(pbVar3,&local_60,pcVar4);
        __cxa_throw(pbVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
    }
    std::__cxx11::string::append((char *)&subdir);
    iVar1 = mkdir(subdir._M_dataplus._M_p,0x1ff);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 != 0x11) {
        pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
        std::__cxx11::string::string((string *)&local_40,subdir._M_dataplus._M_p,&local_81);
        std::operator+(&local_60,&local_40,": ");
        pcVar4 = strerror(*piVar2);
        std::operator+(pbVar3,&local_60,pcVar4);
        __cxa_throw(pbVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
    }
  }
  std::__cxx11::string::_M_assign((string *)&this->src_dir_);
  std::__cxx11::string::~string((string *)&subdir);
  return;
}

Assistant:

void t_dart_generator::init_generator() {
  MKDIR(get_out_dir().c_str());

  if (library_name_.empty()) {
    library_name_ = find_library_name(program_);
  }

  string subdir = get_out_dir() + "/" + library_name_;
  MKDIR(subdir.c_str());
  base_dir_ = subdir;

  if (library_prefix_.empty()) {
    subdir += "/lib";
    MKDIR(subdir.c_str());
    subdir += "/src";
    MKDIR(subdir.c_str());
    src_dir_ = subdir;
  } else {
    src_dir_ = base_dir_;
  }
}